

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O2

void sswap(int n,float *x,int incx,float *y,int incy)

{
  float fVar1;
  undefined1 auVar2 [16];
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  bool bVar7;
  
  if (0 < n) {
    if (incy == 1 && incx == 1) {
      for (uVar6 = 0; (ulong)(uint)n % 3 != uVar6; uVar6 = uVar6 + 1) {
        fVar1 = x[uVar6];
        x[uVar6] = y[uVar6];
        y[uVar6] = fVar1;
      }
      uVar6 = CONCAT44(0,n);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar6;
      lVar3 = SUB168(auVar2 / ZEXT816(3),0);
      for (; SUB164(auVar2 / ZEXT816(3),0) * -3 + (int)uVar6 < n; uVar6 = uVar6 + 3) {
        fVar1 = x[lVar3 * -3 + uVar6];
        x[lVar3 * -3 + uVar6] = y[lVar3 * -3 + uVar6];
        y[lVar3 * -3 + uVar6] = fVar1;
        fVar1 = x[lVar3 * -3 + uVar6 + 1];
        x[lVar3 * -3 + uVar6 + 1] = y[lVar3 * -3 + uVar6 + 1];
        y[lVar3 * -3 + uVar6 + 1] = fVar1;
        fVar1 = x[lVar3 * -3 + uVar6 + 2];
        x[lVar3 * -3 + uVar6 + 2] = y[lVar3 * -3 + uVar6 + 2];
        y[lVar3 * -3 + uVar6 + 2] = fVar1;
      }
    }
    else {
      pfVar4 = y + (incy >> 0x1f & (1 - n) * incy);
      pfVar5 = x + (incx >> 0x1f & (1 - n) * incx);
      while (bVar7 = n != 0, n = n + -1, bVar7) {
        fVar1 = *pfVar5;
        *pfVar5 = *pfVar4;
        *pfVar4 = fVar1;
        pfVar4 = pfVar4 + incy;
        pfVar5 = pfVar5 + incx;
      }
    }
  }
  return;
}

Assistant:

void sswap ( int n, float x[], int incx, float y[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    SSWAP interchanges two float vectors.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, float X[*], one of the vectors to swap.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Input/output, float Y[*], one of the vectors to swap.
//
//    Input, int INCY, the increment between successive elements of Y.
//
{
  int i;
  int ix;
  int iy;
  int m;
  float temp;

  if ( n <= 0 )
  {
  }
  else if ( incx == 1 && incy == 1 )
  {
    m = n % 3;

    for ( i = 0; i < m; i++ )
    {
      temp = x[i];
      x[i] = y[i];
      y[i] = temp;
    }

    for ( i = m; i < n; i = i + 3 )
    {
      temp = x[i];
      x[i] = y[i];
      y[i] = temp;

      temp = x[i+1];
      x[i+1] = y[i+1];
      y[i+1] = temp;

      temp = x[i+2];
      x[i+2] = y[i+2];
      y[i+2] = temp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      temp = x[ix];
      x[ix] = y[iy];
      y[iy] = temp;
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return;
}